

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

pybind11 * __thiscall pybind11::cast<std::__cxx11::string>(pybind11 *this,handle *handle)

{
  string *psVar1;
  handle *in_RDX;
  make_caster<std::__cxx11::basic_string<char>_> local_40;
  handle *local_18;
  handle *handle_local;
  
  local_18 = handle;
  handle_local = (handle *)this;
  detail::load_type<std::__cxx11::string>(&local_40,(detail *)handle,in_RDX);
  psVar1 = detail::type_caster::operator_cast_to_string_((type_caster *)&local_40);
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  detail::
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::~type_caster(&local_40);
  return this;
}

Assistant:

T cast(const handle &handle) {
    static_assert(!detail::cast_is_temporary_value_reference<T>::value,
            "Unable to cast type to reference: value is local to type caster");
    using type_caster = detail::make_caster<T>;
    return detail::load_type<T>(handle).operator typename type_caster::template cast_op_type<T>();
}